

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_unserialize(uchar *bytes,size_t bytes_len,ext_key *key_out)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  uchar *puVar4;
  ext_key *key_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (((bytes == (uchar *)0x0) || (bytes_len != 0x4e)) || (key_out == (ext_key *)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    wally_clear(key_out,0xc0);
    puVar4 = copy_in(&key_out->version,bytes,4);
    uVar2 = be32_to_cpu(key_out->version);
    key_out->version = uVar2;
    _Var1 = version_is_valid(key_out->version,1);
    if (_Var1) {
      puVar4 = copy_in(&key_out->depth,puVar4,1);
      puVar4 = copy_in(key_out->parent160,puVar4,4);
      puVar4 = copy_in(&key_out->child_num,puVar4,4);
      uVar2 = be32_to_cpu(key_out->child_num);
      key_out->child_num = uVar2;
      puVar4 = copy_in(key_out,puVar4,0x20);
      if (*puVar4 == '\0') {
        if ((key_out->version == 0x488b21e) || (key_out->version == 0x43587cf)) {
          iVar3 = wipe_key_fail(key_out);
          return iVar3;
        }
        copy_in(key_out->priv_key,puVar4,0x21);
        iVar3 = key_compute_pub_key(key_out);
        if (iVar3 != 0) {
          iVar3 = wipe_key_fail(key_out);
          return iVar3;
        }
      }
      else {
        if ((key_out->version == 0x488ade4) || (key_out->version == 0x4358394)) {
          iVar3 = wipe_key_fail(key_out);
          return iVar3;
        }
        copy_in(key_out->pub_key,puVar4,0x21);
        bip32_key_strip_private_key(key_out);
      }
      key_compute_hash160(key_out);
      bytes_local._4_4_ = 0;
    }
    else {
      bytes_local._4_4_ = wipe_key_fail(key_out);
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int bip32_key_unserialize(const unsigned char *bytes, size_t bytes_len,
                          struct ext_key *key_out)
{
    if (!bytes || bytes_len != BIP32_SERIALIZED_LEN || !key_out)
        return WALLY_EINVAL;

    wally_clear(key_out, sizeof(*key_out));

    bytes = copy_in(&key_out->version, bytes, sizeof(key_out->version));
    key_out->version = be32_to_cpu(key_out->version);
    if (!version_is_valid(key_out->version, BIP32_FLAG_KEY_PUBLIC))
        return wipe_key_fail(key_out);

    bytes = copy_in(&key_out->depth, bytes, sizeof(key_out->depth));

    /* We only have a partial fingerprint available. Copy it, but the
     * user will need to call bip32_key_set_parent() (FIXME: Implement)
     * later if they want it to be fully populated.
     */
    bytes = copy_in(key_out->parent160, bytes, BIP32_KEY_FINGERPRINT_LEN);
    bytes = copy_in(&key_out->child_num, bytes, sizeof(key_out->child_num));
    key_out->child_num = be32_to_cpu(key_out->child_num);
    bytes = copy_in(key_out->chain_code, bytes, sizeof(key_out->chain_code));

    if (bytes[0] == BIP32_FLAG_KEY_PRIVATE) {
        if (key_out->version == BIP32_VER_MAIN_PUBLIC ||
            key_out->version == BIP32_VER_TEST_PUBLIC)
            return wipe_key_fail(key_out); /* Private key data in public key */

        copy_in(key_out->priv_key, bytes, sizeof(key_out->priv_key));
        if (key_compute_pub_key(key_out) != WALLY_OK)
            return wipe_key_fail(key_out);
    } else {
        if (key_out->version == BIP32_VER_MAIN_PRIVATE ||
            key_out->version == BIP32_VER_TEST_PRIVATE)
            return wipe_key_fail(key_out); /* Public key data in private key */

        copy_in(key_out->pub_key, bytes, sizeof(key_out->pub_key));
        bip32_key_strip_private_key(key_out);
    }

    key_compute_hash160(key_out);
    return WALLY_OK;
}